

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::loadstart(Forth *this)

{
  bool bVar1;
  reference ppVar2;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20;
  iterator foundIt;
  Cell u;
  Forth *this_local;
  
  requireDStackDepth(this,1,"LOADSTART");
  foundIt._M_node._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (foundIt._M_node._4_4_ != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::find(&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::end(&this->blocksInProcess);
    bVar1 = std::operator==(&local_20,&local_28);
    if (bVar1) {
      push(this,foundIt._M_node._4_4_);
      block(this);
      pop(this);
    }
    local_30 = (_Base_ptr)
               std::
               map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
               ::find(&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
    local_20._M_node = local_30;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::end(&this->blocksInProcess);
    bVar1 = std::operator==(&local_20,&local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SaveInput(this);
      setSourceId(this,0);
      setDataCell(this,this->VarOffsetBlkAddress,foundIt._M_node._4_4_);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
               operator*(&local_20);
      setSourceVariables(this,(ppVar2->second).blockLocation,0x400,0);
      this->InterpretState = InterpretSource;
    }
  }
  return;
}

Assistant:

void loadstart(){
			REQUIRE_DSTACK_DEPTH(1, "LOADSTART");
			Cell u = dStack.getTop(); pop();
			if(u>0){
				auto foundIt = blocksInProcess.find(u);
				if (foundIt == blocksInProcess.end()) {
					push(u);
					block();
					pop();
				}
				foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					SaveInput();
					setSourceId(0);
					setDataCell(VarOffsetBlkAddress, Cell(u)); // set BLK=u
					setSourceVariables((*foundIt).second.blockLocation, 1024, 0);
					InterpretState = InterpretSource;
				} 
			}
		}